

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O0

void printRaw(MessageType type,char *message)

{
  FILE *__stream;
  FILE *out;
  char *message_local;
  MessageType type_local;
  
  __stream = (FILE *)getOutFile(type);
  if (type == MESSAGETYPE_ERROR) {
    fprintf(__stream,"FATAL ERROR: ");
  }
  fputs(message,__stream);
  if (type == MESSAGETYPE_ERROR) {
    putc(10,__stream);
    fflush(__stream);
  }
  return;
}

Assistant:

void printRaw (MessageType type, const char* message)
{
	FILE* out = getOutFile(type);

	if (type == MESSAGETYPE_ERROR)
		fprintf(out, "FATAL ERROR: ");

	fputs(message, out);

	if (type == MESSAGETYPE_ERROR)
	{
		putc('\n', out);
		fflush(out);
	}
}